

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::LocaleKey::prefix(LocaleKey *this,UnicodeString *result)

{
  char16_t *buffer_00;
  undefined1 local_d8 [8];
  UnicodeString temp;
  UChar buffer [64];
  UnicodeString *result_local;
  LocaleKey *this_local;
  
  if (this->_kind != -1) {
    buffer_00 = temp.fUnion.fStackFields.fBuffer + 0x17;
    uprv_itou_63(buffer_00,0x40,this->_kind,10,0);
    UnicodeString::UnicodeString((UnicodeString *)local_d8,buffer_00);
    UnicodeString::append(result,(UnicodeString *)local_d8);
    UnicodeString::~UnicodeString((UnicodeString *)local_d8);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKey::prefix(UnicodeString& result) const {
    if (_kind != KIND_ANY) {
        UChar buffer[64];
        uprv_itou(buffer, 64, _kind, 10, 0);
        UnicodeString temp(buffer);
        result.append(temp);
    }
    return result;
}